

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O0

IterateResult __thiscall glcts::GeometryShaderAdjacency::iterate(GeometryShaderAdjacency *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  bool bVar8;
  float fVar9;
  string local_1018 [32];
  char *local_ff8;
  MessageBuilder local_ff0;
  string local_e70 [32];
  char *local_e50;
  MessageBuilder local_e48;
  MessageBuilder local_cc8;
  uint local_b44;
  stringstream local_b40 [4];
  uint n_1;
  stringstream sstreamResult;
  ostream local_b30;
  stringstream local_9b8 [8];
  stringstream sstreamExpected;
  ostream local_9a8;
  string local_830 [32];
  char *local_810;
  MessageBuilder local_808;
  string local_688 [32];
  char *local_668;
  MessageBuilder local_660;
  int local_4dc;
  MessageBuilder local_4d8;
  uint local_358 [2];
  uint n;
  stringstream local_348 [8];
  stringstream sstreamResult_1;
  ostream local_338;
  stringstream local_1c0 [8];
  stringstream sstreamExpected_1;
  ostream local_1b0;
  long local_38;
  float *result_geometry_ptr;
  float *result_adjacency_geometry_ptr;
  long lStack_20;
  GLuint nVertices;
  Functions *gl;
  GeometryShaderAdjacency *this_local;
  
  gl = (Functions *)this;
  initTest(this);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_20 + 0xd8))(this->m_vao_id);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x163);
  if (this->m_test_data->m_gs_code == (char *)0x0) {
    (**(code **)(lStack_20 + 0x48))(0x8c8e,0,this->m_geometry_bo_id);
  }
  else {
    (**(code **)(lStack_20 + 0x48))(0x8c8e,0,this->m_adjacency_geometry_bo_id);
    (**(code **)(lStack_20 + 0x48))(0x8c8e,1,this->m_geometry_bo_id);
  }
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Error configuring transform feedback buffer binding points!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x170);
  (**(code **)(lStack_20 + 0x40))(0x8892,this->m_vertex_data_bo_id);
  GVar3 = (**(code **)(lStack_20 + 0x780))(this->m_po_id,"position_data");
  this->m_position_attribute_location = GVar3;
  (**(code **)(lStack_20 + 0x19f0))
            (this->m_position_attribute_location,this->m_components_input,0x1406,0,0,0);
  (**(code **)(lStack_20 + 0x610))(this->m_position_attribute_location);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Error setting vertex attribute array for position_data attribute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x176);
  if (this->m_test_data->m_index_data_bo_size != 0) {
    (**(code **)(lStack_20 + 0x40))(0x8893,this->m_index_data_bo_id);
  }
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Error binding index data buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x17d);
  (**(code **)(lStack_20 + 0x5e0))(0x8c89);
  (**(code **)(lStack_20 + 0x1680))(this->m_po_id);
  (**(code **)(lStack_20 + 0x30))(this->m_test_data->m_tf_mode);
  bVar8 = true;
  if (this->m_test_data->m_mode != (this->super_TestCaseBase).m_glExtTokens.LINE_STRIP_ADJACENCY) {
    bVar8 = this->m_test_data->m_mode ==
            (this->super_TestCaseBase).m_glExtTokens.TRIANGLE_STRIP_ADJACENCY;
  }
  iVar1 = 2;
  if (bVar8) {
    iVar1 = 1;
  }
  result_adjacency_geometry_ptr._4_4_ = this->m_test_data->m_n_vertices * iVar1;
  if (this->m_test_data->m_index_data_bo_size == 0) {
    (**(code **)(lStack_20 + 0x538))
              (this->m_test_data->m_mode,0,result_adjacency_geometry_ptr._4_4_);
  }
  else {
    (**(code **)(lStack_20 + 0x568))
              (this->m_test_data->m_mode,result_adjacency_geometry_ptr._4_4_,0x1405,0);
  }
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Error while trying to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x193);
  (**(code **)(lStack_20 + 0x4e8))(0x8c89);
  (**(code **)(lStack_20 + 0x638))();
  result_geometry_ptr = (float *)0x0;
  local_38 = 0;
  if (this->m_test_data->m_gs_code != (char *)0x0) {
    (**(code **)(lStack_20 + 0x40))(0x8c8e,this->m_adjacency_geometry_bo_id);
    result_geometry_ptr =
         (float *)(**(code **)(lStack_20 + 0xd00))(0x8c8e,0,this->m_test_data->m_geometry_bo_size,1)
    ;
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"Error when mapping data to client space",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                    ,0x1a2);
    std::__cxx11::stringstream::stringstream(local_1c0);
    std::__cxx11::stringstream::stringstream(local_348);
    std::operator<<(&local_1b0,"[");
    std::operator<<(&local_338,"[");
    for (local_358[0] = 0; local_358[0] < this->m_test_data->m_geometry_bo_size >> 2;
        local_358[0] = local_358[0] + 1) {
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (&local_1b0,this->m_test_data->m_expected_adjacency_geometry[local_358[0]])
      ;
      std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(&local_338,result_geometry_ptr[local_358[0]]);
      std::operator<<(poVar5,", ");
      fVar9 = de::abs<float>(result_geometry_ptr[local_358[0]] -
                             this->m_test_data->m_expected_adjacency_geometry[local_358[0]]);
      if (this->m_epsilon <= fVar9) {
        (**(code **)(lStack_20 + 0x1670))(0x8c8e);
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_4d8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_4d8,(char (*) [5])"At [");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_358);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [99])
                                   "] position adjacency buffer position Reference value is different than the rendered data (epsilon "
                           );
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_epsilon);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4c38f);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2b0b32e);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,this->m_test_data->m_expected_adjacency_geometry + local_358[0]);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [6])") vs ");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b0b32f);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,result_geometry_ptr + local_358[0]);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a94734);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4d8);
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
        this_local._4_4_ = STOP;
        local_4dc = 1;
        goto LAB_016897d2;
      }
    }
    std::operator<<(&local_1b0,"]");
    std::operator<<(&local_338,"]");
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_660,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_660,(char (*) [21])"Adjacency Expected: ");
    std::__cxx11::stringstream::str();
    local_668 = (char *)std::__cxx11::string::c_str();
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_668);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_688);
    tcu::MessageBuilder::~MessageBuilder(&local_660);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_808,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_808,(char (*) [20])"Adjacency Result:  ");
    std::__cxx11::stringstream::str();
    local_810 = (char *)std::__cxx11::string::c_str();
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_810);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_830);
    tcu::MessageBuilder::~MessageBuilder(&local_808);
    (**(code **)(lStack_20 + 0x1670))(0x8c8e);
    local_4dc = 0;
LAB_016897d2:
    std::__cxx11::stringstream::~stringstream(local_348);
    std::__cxx11::stringstream::~stringstream(local_1c0);
    if (local_4dc != 0) {
      return this_local._4_4_;
    }
  }
  (**(code **)(lStack_20 + 0x40))(0x8c8e,this->m_geometry_bo_id);
  local_38 = (**(code **)(lStack_20 + 0xd00))(0x8c8e,0,this->m_test_data->m_geometry_bo_size,1);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Error when mapping data to client space",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x1cc);
  std::__cxx11::stringstream::stringstream(local_9b8);
  std::__cxx11::stringstream::stringstream(local_b40);
  std::operator<<(&local_9a8,"[");
  std::operator<<(&local_b30,"[");
  local_b44 = 0;
  do {
    if (this->m_test_data->m_geometry_bo_size >> 2 <= local_b44) {
      std::operator<<(&local_9a8,"]");
      std::operator<<(&local_b30,"]");
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_e48,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_e48,(char (*) [11])0x2b01f60);
      std::__cxx11::stringstream::str();
      local_e50 = (char *)std::__cxx11::string::c_str();
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_e50);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string(local_e70);
      tcu::MessageBuilder::~MessageBuilder(&local_e48);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_ff0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_ff0,(char (*) [10])0x2b364e5);
      std::__cxx11::stringstream::str();
      local_ff8 = (char *)std::__cxx11::string::c_str();
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_ff8);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string(local_1018);
      tcu::MessageBuilder::~MessageBuilder(&local_ff0);
      (**(code **)(lStack_20 + 0x1670))(0x8c8e);
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
LAB_01689f2d:
      this_local._4_4_ = STOP;
      local_4dc = 1;
      std::__cxx11::stringstream::~stringstream(local_b40);
      std::__cxx11::stringstream::~stringstream(local_9b8);
      return this_local._4_4_;
    }
    poVar5 = (ostream *)
             std::ostream::operator<<(&local_9a8,this->m_test_data->m_expected_geometry[local_b44]);
    std::operator<<(poVar5,", ");
    poVar5 = (ostream *)
             std::ostream::operator<<(&local_b30,*(float *)(local_38 + (ulong)local_b44 * 4));
    std::operator<<(poVar5,", ");
    fVar9 = de::abs<float>(*(float *)(local_38 + (ulong)local_b44 * 4) -
                           this->m_test_data->m_expected_geometry[local_b44]);
    if (this->m_epsilon <= fVar9) {
      (**(code **)(lStack_20 + 0x1670))(0x8c8e);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_cc8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_cc8,(char (*) [5])"At [");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_b44);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [98])
                                 "] position geometry buffer position Reference value is different than the rendered data (epsilon "
                         );
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_epsilon);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4c38f);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2b0b32e);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,this->m_test_data->m_expected_geometry + local_b44);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [6])") vs ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b0b32f);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(float *)(local_38 + (ulong)local_b44 * 4));
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a94734);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_cc8);
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
      goto LAB_01689f2d;
    }
    local_b44 = local_b44 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderAdjacency::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/** Bind a vertex array object */
	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Bind buffer objects used as data store for transform feedback to TF binding points*/
	if (m_test_data.m_gs_code)
	{
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_adjacency_geometry_bo_id);
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, m_geometry_bo_id);
	}
	else
	{
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_geometry_bo_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring transform feedback buffer binding points!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_data_bo_id);
	m_position_attribute_location = gl.getAttribLocation(m_po_id, "position_data");
	gl.vertexAttribPointer(m_position_attribute_location, m_components_input, GL_FLOAT, GL_FALSE, 0, 0);
	gl.enableVertexAttribArray(m_position_attribute_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting vertex attribute array for position_data attribute");

	/* bind index buffer */
	if (m_test_data.m_index_data_bo_size > 0)
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_data_bo_id);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding index data buffer");

	/* Configure program */
	gl.enable(GL_RASTERIZER_DISCARD);
	gl.useProgram(m_po_id);
	gl.beginTransformFeedback(m_test_data.m_tf_mode);

	glw::GLuint nVertices = m_test_data.m_n_vertices * ((m_test_data.m_mode == m_glExtTokens.LINE_STRIP_ADJACENCY ||
														 m_test_data.m_mode == m_glExtTokens.TRIANGLE_STRIP_ADJACENCY) ?
															1 :
															2 /* include adjacency info */);

	/* Use glDrawElements if data is indicied */
	if (m_test_data.m_index_data_bo_size > 0)
	{
		gl.drawElements(m_test_data.m_mode, nVertices, GL_UNSIGNED_INT, 0);
	}
	/* Use glDrawArrays if data is non indicied */
	else
	{
		gl.drawArrays(m_test_data.m_mode, 0, nVertices);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error while trying to render");

	gl.disable(GL_RASTERIZER_DISCARD);
	gl.endTransformFeedback();

	/* Map result buffer objects into client space */
	float* result_adjacency_geometry_ptr = 0;
	float* result_geometry_ptr			 = 0;

	/* If gs is available read adjacency data using TF and compare with expected data*/
	if (m_test_data.m_gs_code)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_adjacency_geometry_bo_id);
		result_adjacency_geometry_ptr =
			(float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_test_data.m_geometry_bo_size, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error when mapping data to client space");

		std::stringstream sstreamExpected;
		std::stringstream sstreamResult;
		sstreamExpected << "[";
		sstreamResult << "[";

		for (unsigned int n = 0; n < m_test_data.m_geometry_bo_size / sizeof(float); ++n)
		{
			sstreamExpected << m_test_data.m_expected_adjacency_geometry[n] << ", ";
			sstreamResult << result_adjacency_geometry_ptr[n] << ", ";

			if (de::abs(result_adjacency_geometry_ptr[n] - m_test_data.m_expected_adjacency_geometry[n]) >= m_epsilon)
			{
				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

				m_testCtx.getLog() << tcu::TestLog::Message << "At [" << n
								   << "] position adjacency buffer position Reference value is different than the "
									  "rendered data (epsilon "
								   << m_epsilon << " )"
								   << " (" << m_test_data.m_expected_adjacency_geometry[n] << ") vs "
								   << "(" << result_adjacency_geometry_ptr[n] << ")" << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}

		sstreamExpected << "]";
		sstreamResult << "]";
		m_testCtx.getLog() << tcu::TestLog::Message << "Adjacency Expected: " << sstreamExpected.str().c_str()
						   << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Adjacency Result:  " << sstreamResult.str().c_str()
						   << tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	}

	/* Read vertex data using TF and compare with expected data*/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_geometry_bo_id);
	result_geometry_ptr =
		(float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_test_data.m_geometry_bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error when mapping data to client space");

	std::stringstream sstreamExpected;
	std::stringstream sstreamResult;
	sstreamExpected << "[";
	sstreamResult << "[";

	for (unsigned int n = 0; n < m_test_data.m_geometry_bo_size / sizeof(float); ++n)
	{
		sstreamExpected << m_test_data.m_expected_geometry[n] << ", ";
		sstreamResult << result_geometry_ptr[n] << ", ";

		if (de::abs(result_geometry_ptr[n] - m_test_data.m_expected_geometry[n]) >= m_epsilon)
		{
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "At [" << n
				<< "] position geometry buffer position Reference value is different than the rendered data (epsilon "
				<< m_epsilon << " )"
				<< " (" << m_test_data.m_expected_geometry[n] << ") vs "
				<< "(" << result_geometry_ptr[n] << ")" << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}
	}

	sstreamExpected << "]";
	sstreamResult << "]";
	m_testCtx.getLog() << tcu::TestLog::Message << "Expected: " << sstreamExpected.str().c_str()
					   << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Result:  " << sstreamResult.str().c_str()
					   << tcu::TestLog::EndMessage;

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}